

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties
               (RecyclableObject *object)

{
  bool bVar1;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this;
  Type local_10;
  RecyclableObject *object_local;
  
  local_10.ptr = (GlobalObject *)object;
  RecyclableObject::GetLibrary(object);
  JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache
            ((JavascriptLibrary *)&stack0xffffffffffffffe8);
  this = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::operator->
                   ((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                    &stack0xffffffffffffffe8);
  bVar1 = PrototypeChainCache<Js::NoSpecialPropertyCache>::Check
                    (this,(RecyclableObject *)local_10.ptr);
  return bVar1;
}

Assistant:

bool JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(_In_ RecyclableObject* object)
    {
        return object->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Check(object);
    }